

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O1

bool __thiscall
Kernel::RobSubstitution::AssocIterator<Kernel::RobSubstitution::UnificationFn>::hasNext
          (AssocIterator<Kernel::RobSubstitution::UnificationFn> *this)

{
  BacktrackData ***pppBVar1;
  RobSubstitution *pRVar2;
  Literal *pLVar3;
  TermList t1;
  Literal *pLVar4;
  TermList t2;
  bool bVar5;
  State SVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->_state == FINISHED) {
    return false;
  }
  if (this->_used != true) {
    return true;
  }
  this->_used = false;
  if (this->_state == FIRST) {
    pRVar2 = this->_subst;
    if ((pRVar2->super_Backtrackable)._bdStack._cursor ==
        (pRVar2->super_Backtrackable)._bdStack._end) {
      ::Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)pRVar2);
    }
    *(pRVar2->super_Backtrackable)._bdStack._cursor = &this->_bdataEqAssoc;
    pppBVar1 = &(pRVar2->super_Backtrackable)._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + 1;
    bVar5 = UnificationFn::associateEqualitySorts
                      (this->_subst,this->_l1,this->_l1i,this->_l2,this->_l2i);
    if (!bVar5) {
      backtrack(this,&this->_bdataEqAssoc);
      this->_state = FINISHED;
      return false;
    }
  }
  else {
    backtrack(this,&this->_bdataMain);
  }
  pRVar2 = this->_subst;
  if ((pRVar2->super_Backtrackable)._bdStack._cursor == (pRVar2->super_Backtrackable)._bdStack._end)
  {
    ::Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)pRVar2);
  }
  *(pRVar2->super_Backtrackable)._bdStack._cursor = &this->_bdataMain;
  pppBVar1 = &(pRVar2->super_Backtrackable)._bdStack._cursor;
  *pppBVar1 = *pppBVar1 + 1;
  SVar6 = this->_state;
  if (SVar6 == NEXT_CLEANUP) {
LAB_005c7b08:
    backtrack(this,&this->_bdataMain);
    backtrack(this,&this->_bdataEqAssoc);
    SVar6 = FINISHED;
  }
  else {
    if (SVar6 == NEXT_REVERSED) {
LAB_005c7aac:
      pLVar3 = this->_l1;
      uVar7 = (ulong)(*(uint *)&(pLVar3->super_Term).field_0xc & 0xfffffff);
      t1._content = (pLVar3->super_Term)._args[uVar7 - 1]._content;
      pLVar4 = this->_l2;
      uVar8 = (ulong)(*(uint *)&(pLVar4->super_Term).field_0xc & 0xfffffff);
      t2._content = (pLVar4->super_Term)._args[uVar8]._content;
      bVar5 = unify(this->_subst,(TermList)(pLVar3->super_Term)._args[uVar7]._content,this->_l1i,
                    (TermList)(pLVar4->super_Term)._args[uVar8 - 1]._content,this->_l2i);
      if (bVar5) {
        bVar5 = unify(this->_subst,t1,this->_l1i,t2,this->_l2i);
        SVar6 = NEXT_CLEANUP;
        if (bVar5) goto LAB_005c7b24;
      }
      goto LAB_005c7b08;
    }
    if (SVar6 != FIRST) goto LAB_005c7b27;
    bVar5 = unifyArgs(this->_subst,&this->_l1->super_Term,this->_l1i,&this->_l2->super_Term,
                      this->_l2i);
    SVar6 = NEXT_REVERSED;
    if (!bVar5) goto LAB_005c7aac;
  }
LAB_005c7b24:
  this->_state = SVar6;
LAB_005c7b27:
  return this->_state != FINISHED;
}

Assistant:

bool hasNext() {
    if (_state == FINISHED) {
      return false;
    }
    if (!_used) {
      return true;
    }
    _used = false;

    if (_state != FIRST) {
      backtrack(_bdataMain);
    } else {
      _subst->bdRecord(_bdataEqAssoc);
      if (!Fn::associateEqualitySorts(_subst, _l1, _l1i, _l2, _l2i)) {
        backtrack(_bdataEqAssoc); // this might not be necessary
        _state = FINISHED;
        return false;
      }
    }

    _subst->bdRecord(_bdataMain);

    switch (_state) {
    case NEXT_STRAIGHT:
      if (Fn::associate(_subst, _l1, _l1i, _l2, _l2i)) {
        _state = NEXT_REVERSED;
        break;
      }
      //no break here intentionally
    case NEXT_REVERSED: {
      TermList t11 = *_l1->nthArgument(0);
      TermList t12 = *_l1->nthArgument(1);
      TermList t21 = *_l2->nthArgument(0);
      TermList t22 = *_l2->nthArgument(1);
      if (Fn::associate(_subst, t11, _l1i, t22, _l2i)) {
        if (Fn::associate(_subst, t12, _l1i, t21, _l2i)) {
          _state = NEXT_CLEANUP;
          break;
        }
        //the first successful association will be undone
        //in case NEXT_CLEANUP
      }
    }
      //no break here intentionally
    case NEXT_CLEANUP:
      //undo the previous match
      backtrack(_bdataMain);
      //undo associateEqualitySorts
      backtrack(_bdataEqAssoc);
      _state = FINISHED;
      break;
    case FINISHED:
      ASSERTION_VIOLATION;
    }
    ASS(_state != FINISHED || (_bdataMain.isEmpty() && _bdataEqAssoc.isEmpty()));
    return _state != FINISHED;
  }